

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void __thiscall MutableBuffer::push(MutableBuffer *this,char *str)

{
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *str_local;
  MutableBuffer *this_local;
  
  local_18 = str;
  str_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,str,&local_39);
  push(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void push(const char *str) { push(std::string(str)); }